

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::SetAllMute(SoundSystemFMOD *this,bool bMute)

{
  FMOD_RESULT _r;
  undefined7 in_register_00000031;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  FmodError local_68;
  
  gFmodRes = FMOD_ChannelGroup_SetMute(this->pChnGrp,CONCAT71(in_register_00000031,bMute));
  if (gFmodRes != FMOD_OK) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"FMOD_ChannelGroup_SetMute(pChnGrp, bMute)",&local_c9);
    _r = gFmodRes;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,&local_ca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"SetAllMute",&local_cb);
    FmodError::FmodError(&local_68,&local_88,_r,&local_a8,0x1ce,&local_c8);
    FmodError::LogErr(&local_68);
    FmodError::~FmodError(&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetAllMute (bool bMute)
{
    FMOD_LOG(FMOD_ChannelGroup_SetMute(pChnGrp, bMute));
}